

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O3

void g2d_line_init_from_points(g2d_line_t *line,double *p0,double *p1)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  line->p[0] = *p0;
  line->p[1] = p0[1];
  auVar2._0_8_ = *p1 - *p0;
  line->u[0] = auVar2._0_8_;
  dVar1 = p1[1] - p0[1];
  auVar2._8_8_ = dVar1;
  dVar1 = (double)SQRT((float)(dVar1 * dVar1 + auVar2._0_8_ * auVar2._0_8_));
  auVar3._8_8_ = dVar1;
  auVar3._0_8_ = dVar1;
  auVar3 = divpd(auVar2,auVar3);
  *(undefined1 (*) [16])line->u = auVar3;
  return;
}

Assistant:

void g2d_line_init_from_points(g2d_line_t *line, const double p0[2], const double p1[2])
{
    line->p[0] = p0[0];
    line->p[1] = p0[1];
    line->u[0] = p1[0]-p0[0];
    line->u[1] = p1[1]-p0[1];
    double mag = sqrtf(sq(line->u[0]) + sq(line->u[1]));

    line->u[0] /= mag;
    line->u[1] /= mag;
}